

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

bool __thiscall
spirv_cross::CompilerGLSL::optimize_read_modify_write
          (CompilerGLSL *this,SPIRType *type,string *lhs,string *rhs)

{
  size_type sVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  char *pcVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> expr;
  char local_41;
  long lStack_40;
  char bop;
  size_type op;
  size_type index;
  string *rhs_local;
  string *lhs_local;
  SPIRType *type_local;
  CompilerGLSL *this_local;
  
  index = (size_type)rhs;
  rhs_local = lhs;
  lhs_local = (string *)type;
  type_local = (SPIRType *)this;
  uVar3 = ::std::__cxx11::string::size();
  lVar4 = ::std::__cxx11::string::size();
  if (uVar3 < lVar4 + 3U) {
    this_local._7_1_ = 0;
  }
  else if ((*(uint *)(lhs_local + 0x14) < 2) || (*(uint *)(lhs_local + 0x18) < 2)) {
    op = ::std::__cxx11::string::find((string *)index,(ulong)rhs_local);
    sVar1 = index;
    if (op == 0) {
      ::std::__cxx11::string::size();
      lVar4 = ::std::__cxx11::string::find_first_of((char *)sVar1,0x4dedc5);
      lStack_40 = lVar4;
      lVar5 = ::std::__cxx11::string::size();
      if (lVar4 == lVar5 + 1) {
        pcVar6 = (char *)::std::__cxx11::string::operator[](index);
        if (*pcVar6 == ' ') {
          pcVar6 = (char *)::std::__cxx11::string::operator[](index);
          sVar1 = index;
          local_41 = *pcVar6;
          ::std::__cxx11::string::size();
          ::std::__cxx11::string::substr((ulong)local_68,sVar1);
          if (((local_41 == '+') || (local_41 == '-')) &&
             ((bVar2 = ::std::operator==(local_68,"1"), bVar2 ||
              (((bVar2 = ::std::operator==(local_68,"uint(1)"), bVar2 ||
                (bVar2 = ::std::operator==(local_68,"1u"), bVar2)) ||
               (bVar2 = ::std::operator==(local_68,"int(1u)"), bVar2)))))) {
            statement<std::__cxx11::string_const&,char&,char&,char_const(&)[2]>
                      (this,rhs_local,&local_41,&local_41,(char (*) [2])0x4d9ce2);
          }
          else {
            statement<std::__cxx11::string_const&,char_const(&)[2],char&,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
                      (this,rhs_local,(char (*) [2])0x4e078e,&local_41,(char (*) [3])0x4f38c3,
                       local_68,(char (*) [2])0x4d9ce2);
          }
          this_local._7_1_ = 1;
          ::std::__cxx11::string::~string((string *)local_68);
        }
        else {
          this_local._7_1_ = 0;
        }
      }
      else {
        this_local._7_1_ = 0;
      }
    }
    else {
      this_local._7_1_ = 0;
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CompilerGLSL::optimize_read_modify_write(const SPIRType &type, const string &lhs, const string &rhs)
{
	// Do this with strings because we have a very clear pattern we can check for and it avoids
	// adding lots of special cases to the code emission.
	if (rhs.size() < lhs.size() + 3)
		return false;

	// Do not optimize matrices. They are a bit awkward to reason about in general
	// (in which order does operation happen?), and it does not work on MSL anyways.
	if (type.vecsize > 1 && type.columns > 1)
		return false;

	auto index = rhs.find(lhs);
	if (index != 0)
		return false;

	// TODO: Shift operators, but it's not important for now.
	auto op = rhs.find_first_of("+-/*%|&^", lhs.size() + 1);
	if (op != lhs.size() + 1)
		return false;

	// Check that the op is followed by space. This excludes && and ||.
	if (rhs[op + 1] != ' ')
		return false;

	char bop = rhs[op];
	auto expr = rhs.substr(lhs.size() + 3);
	// Try to find increments and decrements. Makes it look neater as += 1, -= 1 is fairly rare to see in real code.
	// Find some common patterns which are equivalent.
	if ((bop == '+' || bop == '-') && (expr == "1" || expr == "uint(1)" || expr == "1u" || expr == "int(1u)"))
		statement(lhs, bop, bop, ";");
	else
		statement(lhs, " ", bop, "= ", expr, ";");
	return true;
}